

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityCosseratAdvancedGeneric::ComputeStiffnessMatrix
          (ChElasticityCosseratAdvancedGeneric *this,ChMatrixNM<double,_6,_6> *K,
          ChVector<double> *strain_n,ChVector<double> *strain_m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            (&K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,6,6);
  dVar9 = cos(this->alpha);
  auVar12._0_8_ = sin(this->alpha);
  auVar12._8_56_ = extraout_var;
  dVar1 = this->Byy;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  dVar2 = this->Bzz;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar2;
  dVar3 = this->Cz;
  dVar4 = this->Ax;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar4;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar9 * dVar9;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar12._0_8_ * auVar12._0_8_ * dVar2;
  auVar8 = vfmadd231sd_fma(auVar28,auVar14,auVar17);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar12._0_8_ * auVar12._0_8_ * dVar1;
  auVar17 = vfmadd231sd_fma(auVar25,auVar22,auVar17);
  dVar5 = this->Cy;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar5;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar3 * dVar3;
  auVar14 = vfmadd213sd_fma(auVar32,auVar33,auVar8);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar5 * dVar5;
  auVar17 = vfmadd213sd_fma(auVar29,auVar33,auVar17);
  auVar7._8_8_ = 0x8000000000000000;
  auVar7._0_8_ = 0x8000000000000000;
  auVar8 = vxorpd_avx512vl(auVar18,auVar7);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar9 * (dVar1 - dVar2);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar4 * dVar3 * dVar5;
  auVar18 = vfmsub231sd_fma(auVar19,auVar12._0_16_,auVar15);
  dVar6 = dVar4 * auVar8._0_8_;
  dVar10 = cos(this->beta);
  auVar13._0_8_ = sin(this->beta);
  auVar13._8_56_ = extraout_var_00;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar10;
  dVar1 = this->Hzz;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1;
  dVar2 = this->Hyy;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2;
  dVar5 = this->Sy;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar10 * dVar10;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar13._0_8_ * auVar13._0_8_ * dVar1;
  auVar7 = vfmadd231sd_fma(auVar30,auVar16,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar10 * dVar10 * dVar1;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar13._0_8_ * auVar13._0_8_;
  auVar15 = vfmadd231sd_fma(auVar24,auVar16,auVar26);
  dVar9 = this->Sz;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = this->Txx;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar9 * dVar9;
  auVar8 = vfmadd213sd_fma(auVar31,auVar16,auVar8);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar5 * dVar5;
  auVar8 = vfmadd213sd_fma(auVar34,auVar20,auVar8);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar1 * dVar5;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar10 * dVar2 * dVar9;
  auVar16 = vfmsub231sd_fma(auVar27,auVar21,auVar13._0_16_);
  dVar10 = dVar10 * auVar13._0_8_ * (dVar1 - dVar2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar13._0_8_ * dVar2 * dVar9;
  auVar11 = vfmadd231sd_fma(auVar11,auVar21,auVar35);
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0] =
       dVar4;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[4] =
       dVar4 * dVar3;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[5] =
       dVar6;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[7] =
       auVar7._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[8] =
       dVar10;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[9] =
       auVar16._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xd] =
       dVar10;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xe] =
       auVar15._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xf] =
       auVar11._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x13] =
       auVar16._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x14] =
       auVar11._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x15] =
       auVar8._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x18] =
       dVar4 * dVar3;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1c] =
       auVar14._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1d] =
       auVar18._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1e] =
       dVar6;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x22] =
       auVar18._0_8_;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x23] =
       auVar17._0_8_;
  return;
}

Assistant:

void ChElasticityCosseratAdvancedGeneric::ComputeStiffnessMatrix(ChMatrixNM<double, 6, 6>& K,
                                                                 const ChVector<>& strain_n,
                                                                 const ChVector<>& strain_m) {
    K.setZero(6, 6);
    double cos_alpha = cos(alpha);
    double sin_alpha = sin(alpha);
    double a11 = this->Ax;
    double a22 = this->Byy * pow(cos_alpha, 2.) + this->Bzz * pow(sin_alpha, 2.) + Cz * Cz * this->Ax;
    double a33 = this->Bzz * pow(cos_alpha, 2.) + this->Byy * pow(sin_alpha, 2.) + Cy * Cy * this->Ax;
    double a12 = Cz * this->Ax;
    double a13 = -Cy * this->Ax;
    double a23 = (this->Byy - this->Bzz) * cos_alpha * sin_alpha - Cy * Cz * this->Ax;
    double cos_beta = cos(beta);
    double sin_beta = sin(beta);
    double KsyGA = this->Hyy;
    double KszGA = this->Hzz;
    double s11 = KsyGA * pow(cos_beta, 2.) + KszGA * pow(sin_beta, 2.);
    double s22 = KsyGA * pow(sin_beta, 2.) + KszGA * pow(cos_beta, 2.);  // ..+s_loc_12*sin(beta)*cos(beta);
    double s33 = this->Txx + Sz * Sz * KsyGA + Sy * Sy * KszGA;
    double s12 = (KszGA - KsyGA) * sin_beta * cos_beta;
    double s13 = Sy * KszGA * sin_beta - Sz * KsyGA * cos_beta;
    double s23 = Sy * KszGA * cos_beta + Sz * KsyGA * sin_beta;

    K(0, 0) = a11;
    K(0, 4) = a12;
    K(0, 5) = a13;
    K(1, 1) = s11;
    K(1, 2) = s12;
    K(1, 3) = s13;
    K(2, 1) = s12;
    K(2, 2) = s22;
    K(2, 3) = s23;
    K(3, 1) = s13;
    K(3, 2) = s23;
    K(3, 3) = s33;
    K(4, 0) = a12;
    K(4, 4) = a22;
    K(4, 5) = a23;
    K(5, 0) = a13;
    K(5, 4) = a23;
    K(5, 5) = a33;
}